

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

uint PopChar(StreamIn *in)

{
  uint uVar1;
  uint local_1c;
  uint c;
  StreamIn *in_local;
  
  local_1c = 0xffffffff;
  if (in->pushed != no) {
    if (in->bufpos == 0) {
      __assert_fail("in->bufpos > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/streamio.c"
                    ,0x1a5,"uint PopChar(StreamIn *)");
    }
    uVar1 = in->bufpos - 1;
    in->bufpos = uVar1;
    local_1c = in->charbuf[uVar1];
    if (in->bufpos == 0) {
      in->pushed = no;
    }
    if (local_1c == 10) {
      in->curcol = 1;
      in->curline = in->curline + 1;
      PopLastPos(in);
      return 10;
    }
    in->curcol = in->curcol + 1;
    PopLastPos(in);
  }
  return local_1c;
}

Assistant:

static uint PopChar( StreamIn *in )
{
    uint c = EndOfStream;
    if ( in->pushed )
    {
        assert( in->bufpos > 0 );
        c = in->charbuf[ --in->bufpos ];
        if ( in->bufpos == 0 )
            in->pushed = no;

        if ( c == '\n' )
        {
            in->curcol = 1;
            in->curline++;
            PopLastPos( in );
            return c;
        }
        in->curcol++;
        PopLastPos( in );
    }
    return c;
}